

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O0

void Js::RegexHelper::AppendSubString
               (ScriptContext *scriptContext,JavascriptArray *ary,JavascriptString *input,
               CharCount startInclusive,CharCount endExclusive)

{
  code *pcVar1;
  bool bVar2;
  charcount_t cVar3;
  undefined4 *puVar4;
  JavascriptLibrary *pJVar5;
  CharStringCache *this;
  char16 *pcVar6;
  JavascriptString *local_38;
  JavascriptString *subString;
  CharCount length;
  CharCount endExclusive_local;
  CharCount startInclusive_local;
  JavascriptString *input_local;
  JavascriptArray *ary_local;
  ScriptContext *scriptContext_local;
  
  if (endExclusive < startInclusive) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                ,0x5ef,"(endExclusive >= startInclusive)",
                                "endExclusive >= startInclusive");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  cVar3 = JavascriptString::GetLength(input);
  if (cVar3 < endExclusive) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                ,0x5f0,"(endExclusive <= input->GetLength())",
                                "endExclusive <= input->GetLength()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  cVar3 = endExclusive - startInclusive;
  if (cVar3 == 0) {
    pJVar5 = ScriptContext::GetLibrary(scriptContext);
    local_38 = JavascriptLibrary::GetEmptyString(pJVar5);
  }
  else if (cVar3 == 1) {
    pJVar5 = ScriptContext::GetLibrary(scriptContext);
    this = JavascriptLibrary::GetCharStringCache(pJVar5);
    pcVar6 = JavascriptString::GetString(input);
    local_38 = CharStringCache::GetStringForChar(this,pcVar6[startInclusive]);
  }
  else {
    local_38 = SubString::New(input,startInclusive,cVar3);
  }
  Js::JavascriptArray::DirectAppendItem(ary,local_38);
  return;
}

Assistant:

void RegexHelper::AppendSubString(ScriptContext* scriptContext, JavascriptArray* ary, JavascriptString* input, CharCount startInclusive, CharCount endExclusive)
    {
        Assert(endExclusive >= startInclusive);
        Assert(endExclusive <= input->GetLength());
        CharCount length = endExclusive - startInclusive;
        JavascriptString* subString;
        if (length == 0)
        {
            subString = scriptContext->GetLibrary()->GetEmptyString();
        }
        else if (length == 1)
        {
            subString = scriptContext->GetLibrary()->GetCharStringCache().GetStringForChar(input->GetString()[startInclusive]);
        }
        else
        {
            subString = SubString::New(input, startInclusive, length);
        }
        ary->DirectAppendItem(subString);
    }